

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O0

string_view __thiscall wabt::GetBasename(wabt *this,string_view filename)

{
  unsigned_long *puVar1;
  string_view sVar2;
  size_type local_38;
  size_t last_backslash;
  size_t last_slash;
  string_view filename_local;
  size_t local_10;
  
  filename_local._M_len = filename._M_len;
  last_slash = (size_t)this;
  last_backslash =
       std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                 ((basic_string_view<char,_std::char_traits<char>_> *)&last_slash,'/',
                  0xffffffffffffffff);
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                       ((basic_string_view<char,_std::char_traits<char>_> *)&last_slash,'\\',
                        0xffffffffffffffff);
  if ((last_backslash == 0xffffffffffffffff) && (local_38 == 0xffffffffffffffff)) {
    local_10 = filename_local._M_len;
    filename_local._M_str = (char *)last_slash;
  }
  else {
    if (last_backslash == 0xffffffffffffffff) {
      last_backslash = local_38;
      if (local_38 == 0xffffffffffffffff) {
        local_10 = filename_local._M_len;
        filename_local._M_str = (char *)last_slash;
        return stack0xffffffffffffffe8;
      }
    }
    else if (local_38 != 0xffffffffffffffff) {
      puVar1 = std::max<unsigned_long>(&last_backslash,&local_38);
      last_backslash = *puVar1;
    }
    join_0x00000010_0x00000000_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   ((basic_string_view<char,_std::char_traits<char>_> *)&last_slash,
                    last_backslash + 1,0xffffffffffffffff);
  }
  sVar2._M_len = (size_t)filename_local._M_str;
  sVar2._M_str = (char *)local_10;
  return sVar2;
}

Assistant:

std::string_view GetBasename(std::string_view filename) {
  size_t last_slash = filename.find_last_of('/');
  size_t last_backslash = filename.find_last_of('\\');
  if (last_slash == std::string_view::npos &&
      last_backslash == std::string_view::npos) {
    return filename;
  }

  if (last_slash == std::string_view::npos) {
    if (last_backslash == std::string_view::npos) {
      return filename;
    }
    last_slash = last_backslash;
  } else if (last_backslash != std::string_view::npos) {
    last_slash = std::max(last_slash, last_backslash);
  }

  return filename.substr(last_slash + 1);
}